

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdGetPsbtUtxoData(void *handle,void *psbt_handle,char *txid,uint32_t vout,int64_t *amount,
                      char **locking_script,char **redeem_script,char **descriptor,
                      char **full_tx_hex)

{
  pointer *ppuVar1;
  bool bVar2;
  uint32_t index;
  int iVar3;
  CfdException *pCVar4;
  allocator local_a1;
  void *local_a0;
  OutPoint outpoint;
  Txid local_70;
  string local_50;
  
  local_a0 = handle;
  cfd::Initialize();
  ppuVar1 = (pointer *)
            ((long)&outpoint.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  outpoint.txid_._vptr_Txid = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outpoint,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)&outpoint);
  if (outpoint.txid_._vptr_Txid != (_func_int **)ppuVar1) {
    operator_delete(outpoint.txid_._vptr_Txid);
  }
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (!bVar2) {
    if (*(long *)((long)psbt_handle + 0x18) != 0) {
      std::__cxx11::string::string((string *)&local_50,txid,&local_a1);
      cfd::core::Txid::Txid(&local_70,&local_50);
      cfd::core::OutPoint::OutPoint(&outpoint,&local_70,vout);
      local_70._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if (local_70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      index = cfd::Psbt::GetTxInIndex(*(Psbt **)((long)psbt_handle + 0x18),&outpoint);
      iVar3 = CfdGetPsbtUtxoDataByIndex
                        (local_a0,psbt_handle,index,(char **)0x0,(uint32_t *)0x0,amount,
                         locking_script,redeem_script,descriptor,full_tx_hex);
      outpoint.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if ((void *)CONCAT44(outpoint.txid_.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           outpoint.txid_.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(outpoint.txid_.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         outpoint.txid_.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      return iVar3;
    }
    outpoint.txid_._vptr_Txid = (_func_int **)0x5e393a;
    outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x476;
    outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdGetPsbtUtxoData";
    cfd::core::logger::log<>((CfdSourceLocation *)&outpoint,kCfdLogLevelWarning,"psbt is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    outpoint.txid_._vptr_Txid = (_func_int **)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&outpoint,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&outpoint);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  outpoint.txid_._vptr_Txid = (_func_int **)0x5e393a;
  outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x470;
  outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdGetPsbtUtxoData";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&outpoint,kCfdLogLevelWarning,"txid is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  outpoint.txid_._vptr_Txid = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&outpoint,"Failed to parameter. txid is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&outpoint);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtUtxoData(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    int64_t* amount, char** locking_script, char** redeem_script,
    char** descriptor, char** full_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);
    uint32_t index = psbt_obj->psbt->GetTxInIndex(outpoint);

    return CfdGetPsbtUtxoDataByIndex(
        handle, psbt_handle, index, nullptr, nullptr, amount, locking_script,
        redeem_script, descriptor, full_tx_hex);
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}